

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void sortDecreasingHeap(HighsInt n,vector<double,_std::allocator<double>_> *heap_v,
                       vector<int,_std::allocator<int>_> *heap_ix)

{
  double dVar1;
  value_type vVar2;
  value_type vVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  vector<int,_std::allocator<int>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  int in_EDI;
  double v;
  HighsInt ix;
  HighsInt pa_p;
  HighsInt cd_p;
  HighsInt srt_p;
  HighsInt fo_p;
  double local_38;
  value_type local_2c;
  int local_24;
  int local_20;
  int local_1c;
  
  if (in_EDI < 2) {
    return;
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,0);
  local_20 = in_EDI;
  if (*pvVar5 == 1) {
    local_1c = 1;
  }
  else {
    local_1c = in_EDI / 2 + 1;
  }
  do {
    if (local_1c < 2) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_20);
      local_38 = *pvVar6;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_20);
      local_2c = *pvVar5;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
      vVar2 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_20);
      *pvVar6 = vVar2;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,1);
      vVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_20);
      *pvVar5 = vVar3;
      local_20 = local_20 + -1;
      iVar4 = local_1c;
      if (local_20 == 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
        *pvVar6 = local_38;
        pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,1);
        *pvVar5 = local_2c;
        return;
      }
    }
    else {
      iVar4 = local_1c + -1;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar4);
      local_38 = *pvVar6;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar4);
      local_2c = *pvVar5;
      local_1c = iVar4;
    }
    while (local_24 = iVar4 * 2, local_24 <= local_20) {
      if (local_24 < local_20) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
        dVar1 = *pvVar6;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RSI,(long)(local_24 + 1));
        if (*pvVar6 <= dVar1 && dVar1 != *pvVar6) {
          local_24 = local_24 + 1;
        }
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
      if (local_38 < *pvVar6 || local_38 == *pvVar6) break;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)local_24);
      vVar2 = *pvVar6;
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar4);
      *pvVar6 = vVar2;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)local_24);
      vVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar4);
      *pvVar5 = vVar3;
      iVar4 = local_24;
    }
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,(long)iVar4);
    *pvVar6 = local_38;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](in_RDX,(long)iVar4);
    *pvVar5 = local_2c;
  } while( true );
}

Assistant:

void sortDecreasingHeap(const HighsInt n, vector<double>& heap_v,
                        vector<HighsInt>& heap_ix) {
  HighsInt fo_p, srt_p;
  HighsInt cd_p, pa_p;
  HighsInt ix;
  double v;
  if (n <= 1) return;
  if (heap_ix[0] != 1) {
    // The data are assumed to be completely unordered. A heap will be formed
    // and sorted.
    fo_p = n / 2 + 1;
    srt_p = n;
  } else {
    // The data are assumed to form a heap which is to be sorted.
    fo_p = 1;
    srt_p = n;
  }
  for (;;) {
    if (fo_p > 1) {
      fo_p = fo_p - 1;
      v = heap_v[fo_p];
      ix = heap_ix[fo_p];
    } else {
      v = heap_v[srt_p];
      ix = heap_ix[srt_p];
      heap_v[srt_p] = heap_v[1];
      heap_ix[srt_p] = heap_ix[1];
      srt_p--;
      if (srt_p == 1) {
        heap_v[1] = v;
        heap_ix[1] = ix;
        return;
      }
    }
    pa_p = fo_p;
    cd_p = fo_p + fo_p;
    for (;;) {
      if (cd_p <= srt_p) {
        if (cd_p < srt_p) {
          if (heap_v[cd_p] > heap_v[cd_p + 1]) cd_p = cd_p + 1;
        }
        if (v > heap_v[cd_p]) {
          heap_v[pa_p] = heap_v[cd_p];
          heap_ix[pa_p] = heap_ix[cd_p];
          pa_p = cd_p;
          cd_p = cd_p + cd_p;
          continue;
        }
      }
      break;
    }
    heap_v[pa_p] = v;
    heap_ix[pa_p] = ix;
  }
  return;
}